

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O2

void add_light(chunk_conflict *c,player *p,loc_conflict sgrid,wchar_t radius,wchar_t inten)

{
  int *piVar1;
  _Bool _Var2;
  wchar_t wVar3;
  loc_conflict grid2;
  loc grid;
  wchar_t wVar4;
  wchar_t y;
  wchar_t x;
  wchar_t x_00;
  
  for (y = -radius; x_00 = -radius, y <= radius; y = y + L'\x01') {
    for (; x_00 <= radius; x_00 = x_00 + L'\x01') {
      grid2 = loc(x_00,y);
      grid = (loc)loc_sum(sgrid,grid2);
      wVar3 = distance(sgrid,(loc_conflict)grid);
      _Var2 = square_in_bounds(c,grid);
      if (((wVar3 <= radius && _Var2) && (_Var2 = los(c,sgrid,(loc_conflict)grid), _Var2)) &&
         ((_Var2 = square_allowslos(c,grid), _Var2 ||
          (_Var2 = source_can_light_wall(c,p,sgrid,(loc_conflict)grid), _Var2)))) {
        wVar4 = -wVar3;
        if (inten < L'\x01') {
          wVar4 = wVar3;
        }
        piVar1 = &c->squares[(long)grid >> 0x20][grid.x].light;
        *piVar1 = *piVar1 + wVar4 + inten;
      }
    }
  }
  return;
}

Assistant:

static void add_light(struct chunk *c, struct player *p, struct loc sgrid,
		int radius, int inten)
{
	int y;

	for (y = -radius; y <= radius; y++) {
		int x;

		for (x = -radius; x <= radius; x++) {
			struct loc grid = loc_sum(sgrid, loc(x, y));
			int dist = distance(sgrid, grid);
			if (!square_in_bounds(c, grid)) continue;
			if (dist > radius) continue;
			/* Don't propagate the light through walls. */
			if (!los(c, sgrid, grid)) continue;
			/*
			 * Only light a wall if the face lit is possibly visible
			 * to the player.
			 */
			if (!square_allowslos(c, grid) && !source_can_light_wall(c,
					p, sgrid, grid)) continue;
			/* Adjust the light level */
			if (inten > 0) {
				/* Light getting less further away */
				c->squares[grid.y][grid.x].light +=
					inten - dist;
			} else {
				/* Light getting greater further away */
				c->squares[grid.y][grid.x].light +=
					inten + dist;
			}
		}
	}
}